

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O1

void __thiscall HighsDomain::changeBound(HighsDomain *this,HighsDomainChange boundchg,Reason reason)

{
  pointer *ppHVar1;
  pointer *ppRVar2;
  double *pdVar3;
  double dVar4;
  pointer pdVar5;
  pointer piVar6;
  iterator __position;
  iterator __position_00;
  iterator __position_01;
  int iVar7;
  long lVar8;
  ulong uVar9;
  vector<int,_std::allocator<int>_> *pvVar10;
  undefined8 uVar11;
  bool bVar12;
  double oldbound;
  HighsDomainChange local_38;
  Reason local_28;
  int local_1c;
  double local_18;
  
  uVar11 = boundchg._8_8_;
  local_38.boundval = boundchg.boundval;
  local_38.boundtype = boundchg.boundtype;
  iVar7 = boundchg.column;
  local_28.type = reason.type;
  if (local_38.boundtype == kLower) {
    pdVar5 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar4 = pdVar5[iVar7];
    if ((local_38.boundval <= dVar4) && (local_38.boundval = dVar4, local_28.type != -1)) {
      return;
    }
    dVar4 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar7];
    if (dVar4 < local_38.boundval) {
      pdVar3 = &((this->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
      if (local_38.boundval - dVar4 < *pdVar3 || local_38.boundval - dVar4 == *pdVar3) {
        pdVar3 = pdVar5 + iVar7;
        local_38.boundval = dVar4;
        if ((dVar4 == *pdVar3) && (!NAN(dVar4) && !NAN(*pdVar3))) {
          return;
        }
      }
      else if (this->infeasible_ == false) {
        uVar9 = (long)(this->domchgstack_).
                      super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->domchgstack_).
                      super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        this->infeasible_pos = (HighsInt)(uVar9 >> 4);
        this->infeasible_ = true;
        this->infeasible_reason = (Reason)(uVar9 * 0x10000000 | 0xfffffffa);
      }
    }
    pvVar10 = &this->colLowerPos_;
  }
  else {
    pdVar5 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar4 = pdVar5[iVar7];
    if ((dVar4 <= local_38.boundval) && (local_38.boundval = dVar4, local_28.type != -1)) {
      return;
    }
    dVar4 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar7];
    if (local_38.boundval < dVar4) {
      pdVar3 = &((this->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
      if (dVar4 - local_38.boundval < *pdVar3 || dVar4 - local_38.boundval == *pdVar3) {
        pdVar3 = pdVar5 + iVar7;
        local_38.boundval = dVar4;
        if ((dVar4 == *pdVar3) && (!NAN(dVar4) && !NAN(*pdVar3))) {
          return;
        }
      }
      else if (this->infeasible_ == false) {
        uVar9 = (long)(this->domchgstack_).
                      super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->domchgstack_).
                      super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        this->infeasible_pos = (HighsInt)(uVar9 >> 4);
        this->infeasible_ = true;
        this->infeasible_reason = (Reason)(uVar9 * 0x10000000 | 0xfffffffa);
      }
    }
    pvVar10 = &this->colUpperPos_;
  }
  piVar6 = (pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  local_1c = piVar6[iVar7];
  piVar6[iVar7] =
       (int)((ulong)((long)(this->domchgstack_).
                           super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->domchgstack_).
                          super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 4);
  bVar12 = local_28.type == -1;
  local_38._8_8_ = uVar11;
  local_28 = reason;
  if (bVar12) {
    iVar7 = (int)((ulong)((long)(this->domchgstack_).
                                super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->domchgstack_).
                               super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4);
    local_18 = (double)CONCAT44(local_18._4_4_,iVar7);
    __position._M_current =
         (this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&this->branchPos_,__position,(int *)&local_18);
    }
    else {
      *__position._M_current = iVar7;
      (this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  lVar8 = (long)local_38.column;
  if ((((this->mipsolver->model_->integrality_).
        super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
        super__Vector_impl_data._M_start[lVar8] == kContinuous) ||
      (dVar4 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar8], dVar4 != 0.0)) || (NAN(dVar4))) {
    bVar12 = false;
  }
  else {
    bVar12 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar8] == 1.0;
  }
  local_18 = doChangeBound(this,&local_38);
  std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
  emplace_back<double&,int&>
            ((vector<std::pair<double,int>,std::allocator<std::pair<double,int>>> *)
             &this->prevboundval_,&local_18,&local_1c);
  __position_00._M_current =
       (this->domchgstack_).
       super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->domchgstack_).super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>::
    _M_realloc_insert<HighsDomainChange_const&>
              ((vector<HighsDomainChange,std::allocator<HighsDomainChange>> *)&this->domchgstack_,
               __position_00,&local_38);
  }
  else {
    (__position_00._M_current)->boundval = local_38.boundval;
    (__position_00._M_current)->column = local_38.column;
    (__position_00._M_current)->boundtype = local_38.boundtype;
    ppHVar1 = &(this->domchgstack_).
               super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppHVar1 = *ppHVar1 + 1;
  }
  __position_01._M_current =
       (this->domchgreason_).
       super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position_01._M_current ==
      (this->domchgreason_).
      super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<HighsDomain::Reason,std::allocator<HighsDomain::Reason>>::
    _M_realloc_insert<HighsDomain::Reason_const&>
              ((vector<HighsDomain::Reason,std::allocator<HighsDomain::Reason>> *)
               &this->domchgreason_,__position_01,&local_28);
  }
  else {
    *__position_01._M_current = local_28;
    ppRVar2 = &(this->domchgreason_).
               super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl
               .super__Vector_impl_data._M_finish;
    *ppRVar2 = *ppRVar2 + 1;
  }
  if ((bVar12) && (this->infeasible_ == false)) {
    dVar4 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[local_38.column];
    pdVar3 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + local_38.column;
    if ((dVar4 == *pdVar3) && (!NAN(dVar4) && !NAN(*pdVar3))) {
      HighsCliqueTable::addImplications
                (&((this->mipsolver->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->cliquetable,
                 this,local_38.column,(uint)(0.5 < dVar4));
    }
  }
  return;
}

Assistant:

void HighsDomain::changeBound(HighsDomainChange boundchg, Reason reason) {
  assert(boundchg.column >= 0);
  assert(boundchg.column < (HighsInt)col_upper_.size());
  // assert(infeasible_ == 0);
  // if (reason.type == Reason::kObjective) {
  //   if (!mipsolver->submip)
  //     printf("objective propagator changed %s bound of column %d to %g\n",
  //            boundchg.boundtype == HighsBoundType::kLower ? "lower" :
  //            "upper", boundchg.column, boundchg.boundval);
  // }

  HighsInt prevPos;
  if (boundchg.boundtype == HighsBoundType::kLower) {
    if (boundchg.boundval <= col_lower_[boundchg.column]) {
      if (reason.type != Reason::kBranching) return;
      boundchg.boundval = col_lower_[boundchg.column];
    }
    if (boundchg.boundval > col_upper_[boundchg.column]) {
      if (boundchg.boundval - col_upper_[boundchg.column] >
          mipsolver->mipdata_->feastol) {
        mipsolver->mipdata_->debugSolution.nodePruned(*this);
        if (!infeasible_) {
          infeasible_pos = domchgstack_.size();
          infeasible_ = true;
          infeasible_reason = Reason::conflictingBounds(domchgstack_.size());
        }
      } else {
        boundchg.boundval = col_upper_[boundchg.column];
        if (boundchg.boundval == col_lower_[boundchg.column]) return;
      }
    }

    prevPos = colLowerPos_[boundchg.column];
    colLowerPos_[boundchg.column] = domchgstack_.size();
  } else {
    if (boundchg.boundval >= col_upper_[boundchg.column]) {
      if (reason.type != Reason::kBranching) return;
      boundchg.boundval = col_upper_[boundchg.column];
    }
    if (boundchg.boundval < col_lower_[boundchg.column]) {
      if (col_lower_[boundchg.column] - boundchg.boundval >
          mipsolver->mipdata_->feastol) {
        mipsolver->mipdata_->debugSolution.nodePruned(*this);
        if (!infeasible_) {
          infeasible_pos = domchgstack_.size();
          infeasible_ = true;
          infeasible_reason = Reason::conflictingBounds(domchgstack_.size());
        }
      } else {
        boundchg.boundval = col_lower_[boundchg.column];
        if (boundchg.boundval == col_upper_[boundchg.column]) return;
      }
    }

    prevPos = colUpperPos_[boundchg.column];
    colUpperPos_[boundchg.column] = domchgstack_.size();
  }

  mipsolver->mipdata_->debugSolution.boundChangeAdded(
      *this, boundchg, reason.type == Reason::kBranching);

  if (reason.type == Reason::kBranching)
    branchPos_.push_back(domchgstack_.size());

  assert(prevPos < (HighsInt)domchgstack_.size());

  bool binary = isBinary(boundchg.column);

  double oldbound = doChangeBound(boundchg);

  prevboundval_.emplace_back(oldbound, prevPos);
  domchgstack_.push_back(boundchg);
  domchgreason_.push_back(reason);

  if (binary && !infeasible_ && isFixed(boundchg.column))
    mipsolver->mipdata_->cliquetable.addImplications(
        *this, boundchg.column, col_lower_[boundchg.column] > 0.5);
}